

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
PtexHashMap(PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
            *this)

{
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_oldEntries).
  super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::Entry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initContents(this);
  return;
}

Assistant:

PtexHashMap()
    {
        initContents();
    }